

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupArray(Vec_Ptr_t *vArray)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  int local_38;
  int local_34;
  int k;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Man_t *p;
  Vec_Ptr_t *vArray_local;
  
  iVar1 = Vec_PtrSize(vArray);
  if (iVar1 == 0) {
    vArray_local = (Vec_Ptr_t *)0x0;
  }
  else {
    pNew = (Aig_Man_t *)Vec_PtrEntry(vArray,0);
    for (local_38 = 0; iVar1 = Vec_PtrSize(vArray), local_38 < iVar1; local_38 = local_38 + 1) {
      p_00 = (Aig_Man_t *)Vec_PtrEntry(vArray,local_38);
      iVar1 = Aig_ManRegNum(p_00);
      if (iVar1 != 0) {
        __assert_fail("Aig_ManRegNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                      ,0x4f1,"Aig_Man_t *Aig_ManDupArray(Vec_Ptr_t *)");
      }
      iVar1 = Aig_ManCiNum(p_00);
      iVar2 = Aig_ManCiNum(pNew);
      if (iVar1 != iVar2) {
        __assert_fail("Aig_ManCiNum(pNew) == Aig_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                      ,0x4f2,"Aig_Man_t *Aig_ManDupArray(Vec_Ptr_t *)");
      }
    }
    vArray_local = (Vec_Ptr_t *)Aig_ManStart(10000);
    pcVar3 = Abc_UtilStrsav(pNew->pName);
    ((Aig_Man_t *)vArray_local)->pName = pcVar3;
    for (local_34 = 0; iVar1 = Vec_PtrSize(pNew->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
      Vec_PtrEntry(pNew->vCis,local_34);
      Aig_ObjCreateCi((Aig_Man_t *)vArray_local);
    }
    for (local_38 = 0; iVar1 = Vec_PtrSize(vArray), local_38 < iVar1; local_38 = local_38 + 1) {
      pNew = (Aig_Man_t *)Vec_PtrEntry(vArray,local_38);
      pAVar4 = Aig_ManConst1((Aig_Man_t *)vArray_local);
      pAVar5 = Aig_ManConst1(pNew);
      (pAVar5->field_5).pData = pAVar4;
      for (local_34 = 0; iVar1 = Vec_PtrSize(pNew->vCis), local_34 < iVar1; local_34 = local_34 + 1)
      {
        pvVar6 = Vec_PtrEntry(pNew->vCis,local_34);
        pAVar4 = Aig_ManCi((Aig_Man_t *)vArray_local,local_34);
        *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
      }
      for (local_34 = 0; iVar1 = Vec_PtrSize(pNew->vObjs), local_34 < iVar1; local_34 = local_34 + 1
          ) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pNew->vObjs,local_34);
        if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
          pAVar5 = Aig_ObjChild0Copy(pAVar4);
          p1 = Aig_ObjChild1Copy(pAVar4);
          pAVar5 = Aig_And((Aig_Man_t *)vArray_local,pAVar5,p1);
          (pAVar4->field_5).pData = pAVar5;
        }
      }
      for (local_34 = 0; iVar1 = Vec_PtrSize(pNew->vCos), local_34 < iVar1; local_34 = local_34 + 1)
      {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pNew->vCos,local_34);
        pAVar4 = Aig_ObjChild0Copy(pAVar4);
        Aig_ObjCreateCo((Aig_Man_t *)vArray_local,pAVar4);
      }
    }
    iVar1 = Aig_ManRegNum(pNew);
    Aig_ManSetRegNum((Aig_Man_t *)vArray_local,iVar1);
    iVar1 = Aig_ManCheck((Aig_Man_t *)vArray_local);
    if (iVar1 == 0) {
      printf("Aig_ManDupSimple(): The check has failed.\n");
    }
  }
  return (Aig_Man_t *)vArray_local;
}

Assistant:

Aig_Man_t * Aig_ManDupArray( Vec_Ptr_t * vArray )
{
    Aig_Man_t * p, * pNew;
    Aig_Obj_t * pObj;
    int i, k;
    if ( Vec_PtrSize(vArray) == 0 )
        return NULL;
    p = (Aig_Man_t *)Vec_PtrEntry( vArray, 0 );
    Vec_PtrForEachEntry( Aig_Man_t *, vArray, pNew, k )
    {
        assert( Aig_ManRegNum(pNew) == 0 );
        assert( Aig_ManCiNum(pNew) == Aig_ManCiNum(p) );
    }
    // create the new manager
    pNew = Aig_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Aig_ManForEachCi( p, pObj, i )
        Aig_ObjCreateCi(pNew);
    // create the PIs
    Vec_PtrForEachEntry( Aig_Man_t *, vArray, p, k )
    {
        Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
        Aig_ManForEachCi( p, pObj, i )
            pObj->pData = Aig_ManCi( pNew, i );
        Aig_ManForEachNode( p, pObj, i )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        Aig_ManForEachCo( p, pObj, i )
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}